

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O2

void __thiscall kj::_::anon_unknown_0::TestCase270::run(TestCase270 *this)

{
  bool bVar1;
  size_t sVar2;
  int *in_R8;
  int line;
  StringPtr local_1b0;
  int i;
  StringPtr local_198;
  Array<char> local_188;
  Exception exception;
  
  i = 0x7b;
  line = 0x111;
  Debug::makeDescription<char_const(&)[4],int&>
            ((String *)&local_188,(Debug *)"\"foo\", i","foo",(char (*) [4])&i,in_R8);
  Exception::Exception
            (&exception,DISCONNECTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,0x111,(String *)&local_188);
  Array<char>::~Array(&local_188);
  if ((exception.type != DISCONNECTED) && (Debug::minSeverity < 3)) {
    local_1b0.content.ptr = (char *)CONCAT44(local_1b0.content.ptr._4_4_,2);
    local_198.content.ptr = (char *)CONCAT44(local_198.content.ptr._4_4_,exception.type);
    Debug::log<char_const(&)[74],kj::Exception::Type,kj::Exception::Type>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x113,ERROR,
               "\"failed: expected \" \"(Exception::Type::DISCONNECTED) == (exception.getType())\", Exception::Type::DISCONNECTED, exception.getType()"
               ,(char (*) [74])
                "failed: expected (Exception::Type::DISCONNECTED) == (exception.getType())",
               (Type *)&local_1b0,(Type *)&local_198);
  }
  local_1b0.content.ptr =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
  ;
  local_1b0.content.size_ = 0x69;
  sVar2 = strlen(exception.file);
  local_198.content.size_ = sVar2 + 1;
  local_198.content.ptr = exception.file;
  bVar1 = StringPtr::endsWith(&local_1b0,&local_198);
  if (Debug::minSeverity < 3 && !bVar1) {
    Debug::log<char_const(&)[169]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x114,ERROR,
               "\"failed: expected \" \"kj::StringPtr(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\\\").endsWith(exception.getFile())\""
               ,(char (*) [169])
                "failed: expected kj::StringPtr(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\").endsWith(exception.getFile())"
              );
  }
  if ((exception.line != 0x111) && (Debug::minSeverity < 3)) {
    local_1b0.content.ptr = (char *)CONCAT44(local_1b0.content.ptr._4_4_,exception.line);
    Debug::log<char_const(&)[49],int&,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x115,ERROR,
               "\"failed: expected \" \"(line) == (exception.getLine())\", line, exception.getLine()"
               ,(char (*) [49])"failed: expected (line) == (exception.getLine())",&line,
               (int *)&local_1b0);
  }
  local_1b0.content.ptr = exception.description.content.ptr;
  if (exception.description.content.size_ == 0) {
    local_1b0.content.ptr = "";
  }
  local_1b0.content.size_ =
       exception.description.content.size_ + (exception.description.content.size_ == 0);
  bVar1 = operator==("foo; i = 123",&local_1b0);
  if (!bVar1 && Debug::minSeverity < 3) {
    if (exception.description.content.size_ == 0) {
      exception.description.content.ptr = "";
    }
    local_1b0.content.size_ =
         exception.description.content.size_ + (exception.description.content.size_ == 0);
    local_1b0.content.ptr = exception.description.content.ptr;
    Debug::log<char_const(&)[66],char_const(&)[13],kj::StringPtr>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x116,ERROR,
               "\"failed: expected \" \"(\\\"foo; i = 123\\\") == (exception.getDescription())\", \"foo; i = 123\", exception.getDescription()"
               ,(char (*) [66])"failed: expected (\"foo; i = 123\") == (exception.getDescription())"
               ,(char (*) [13])"foo; i = 123",&local_1b0);
  }
  Exception::~Exception(&exception);
  return;
}

Assistant:

TEST(Debug, Exception) {
  int i = 123;

  int line = __LINE__; Exception exception = KJ_EXCEPTION(DISCONNECTED, "foo", i);

  EXPECT_EQ(Exception::Type::DISCONNECTED, exception.getType());
  EXPECT_TRUE(kj::StringPtr(__FILE__).endsWith(exception.getFile()));
  EXPECT_EQ(line, exception.getLine());
  EXPECT_EQ("foo; i = 123", exception.getDescription());
}